

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::anon_unknown_0::GeneratedMessageReflectionTest_ReleaseMessageTest_Test::TestBody
          (GeneratedMessageReflectionTest_ReleaseMessageTest_Test *this)

{
  Descriptor *base_descriptor;
  ReflectionTester reflection_tester;
  TestAllTypes message;
  
  proto2_unittest::TestAllTypes::TestAllTypes(&message);
  base_descriptor = proto2_unittest::TestAllTypes::GetDescriptor();
  TestUtil::ReflectionTester::ReflectionTester(&reflection_tester,base_descriptor);
  TestUtil::ReflectionTester::ExpectMessagesReleasedViaReflection
            (&reflection_tester,&message.super_Message,IS_NULL);
  TestUtil::ReflectionTester::SetAllFieldsViaReflection(&reflection_tester,&message.super_Message);
  TestUtil::ReflectionTester::ExpectMessagesReleasedViaReflection
            (&reflection_tester,&message.super_Message,NOT_NULL);
  TestUtil::ReflectionTester::SetAllFieldsViaReflection(&reflection_tester,&message.super_Message);
  proto2_unittest::TestAllTypes::Clear(&message);
  TestUtil::ReflectionTester::ExpectMessagesReleasedViaReflection
            (&reflection_tester,&message.super_Message,CAN_BE_NULL);
  TestUtil::SetAllFields<proto2_unittest::TestAllTypes>(&message);
  TestUtil::ExpectAllFieldsSet<proto2_unittest::TestAllTypes>(&message);
  proto2_unittest::TestAllTypes::~TestAllTypes(&message);
  return;
}

Assistant:

TEST(GeneratedMessageReflectionTest, ReleaseMessageTest) {
  unittest::TestAllTypes message;
  TestUtil::ReflectionTester reflection_tester(
      unittest::TestAllTypes::descriptor());

  // When nothing is set, we expect all released messages to be nullptr.
  reflection_tester.ExpectMessagesReleasedViaReflection(
      &message, TestUtil::ReflectionTester::IS_NULL);

  // After fields are set we should get non-nullptr releases.
  reflection_tester.SetAllFieldsViaReflection(&message);
  reflection_tester.ExpectMessagesReleasedViaReflection(
      &message, TestUtil::ReflectionTester::NOT_NULL);

  // After Clear() we may or may not get a message from ReleaseMessage().
  // This is implementation specific.
  reflection_tester.SetAllFieldsViaReflection(&message);
  message.Clear();
  reflection_tester.ExpectMessagesReleasedViaReflection(
      &message, TestUtil::ReflectionTester::CAN_BE_NULL);

  // Test a different code path for setting after releasing.
  TestUtil::SetAllFields(&message);
  TestUtil::ExpectAllFieldsSet(message);
}